

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O1

void __thiscall vector_<char>::push_back(vector_<char> *this,char *val)

{
  if (this->capacity < this->_size + 1) {
    resize(this);
  }
  (this->arr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl[this->_size] = *val;
  this->_size = this->_size + 1;
  return;
}

Assistant:

void push_back(const T &val) {
        if (_size + 1 > capacity) {
            resize();
        }

        arr[_size] = val;
        ++_size;
    }